

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O2

int __thiscall
de::BlockBuffer<unsigned_char>::readFromCurrentBlock
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements,bool blocking)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  deBool dVar5;
  undefined8 *puVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  iVar10 = this->m_readPos;
  if (iVar10 == 0) {
    if (blocking) {
      deSemaphore_decrement(this->m_fill);
    }
    else {
      dVar5 = deSemaphore_tryDecrement(this->m_fill);
      if (dVar5 == 0) {
        return 0;
      }
    }
    if (this->m_canceled != 0) {
      deSemaphore_increment(this->m_fill);
      Mutex::unlock(&this->m_readLock);
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = &PTR__exception_001518b0;
      __cxa_throw(puVar6,&BufferCanceledException::typeinfo,std::exception::~exception);
    }
    iVar10 = this->m_readPos;
  }
  iVar1 = this->m_readBlock;
  iVar2 = this->m_blockSize;
  puVar4 = this->m_elements;
  iVar3 = this->m_numUsedInBlock[iVar1];
  uVar8 = iVar3 - iVar10;
  if (numElements < (int)uVar8) {
    uVar8 = numElements;
  }
  uVar7 = 0;
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)uVar8;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    elements[uVar7] = puVar4[(long)(this->m_readPos + (int)uVar7) + (long)(iVar2 * iVar1)];
  }
  iVar10 = this->m_readPos + uVar8;
  this->m_readPos = iVar10;
  if (iVar10 == iVar3) {
    this->m_readBlock = (this->m_readBlock + 1) % this->m_numBlocks;
    this->m_readPos = 0;
    deSemaphore_increment(this->m_empty);
  }
  return uVar8;
}

Assistant:

int BlockBuffer<T>::readFromCurrentBlock (int numElements, T* elements, bool blocking)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_readPos == 0)
	{
		/* Read thread doesn't own current block - need to acquire. */
		if (blocking)
			deSemaphore_decrement(m_fill);
		else
		{
			if (!deSemaphore_tryDecrement(m_fill))
				return 0;
		}

		/* Check for canceled bit. */
		if (m_canceled)
		{
			// \todo [2012-07-06 pyry] A bit hackish to assume that read lock is not freed if exception is thrown out here.
			deSemaphore_increment(m_fill);
			m_readLock.unlock();
			throw CanceledException();
		}
	}

	/* Read thread now owns current block. */
	const T*	block			= m_elements + m_readBlock*m_blockSize;
	int			numUsedInBlock	= m_numUsedInBlock[m_readBlock];
	int			numToRead		= de::min(numElements, numUsedInBlock-m_readPos);

	DE_ASSERT(numToRead > 0);

	for (int ndx = 0; ndx < numToRead; ndx++)
		elements[ndx] = block[m_readPos+ndx];

	m_readPos += numToRead;

	if (m_readPos == numUsedInBlock)
	{
		/* Free current read block and advance. */
		m_readBlock		= (m_readBlock+1) % m_numBlocks;
		m_readPos		= 0;
		deSemaphore_increment(m_empty);
	}

	return numToRead;
}